

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O0

void __thiscall
TPZGeoMesh::BuildElementsAroundNode
          (TPZGeoMesh *this,int64_t currentnode,
          map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
          *elmap)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  TPZGeoEl *pTVar4;
  long lVar5;
  TPZGeoEl *pTVar6;
  TPZGeoEl *this_00;
  key_type_conflict1 *in_RDX;
  long in_RSI;
  int numnode_1;
  TPZGeoElSide neigh;
  int is;
  int nside;
  int numnode;
  int64_t i;
  TPZGeoEl *el;
  iterator iel;
  iterator ielprev;
  map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
  *in_stack_fffffffffffffea8;
  map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
  *in_stack_fffffffffffffeb0;
  iterator in_stack_fffffffffffffeb8;
  key_type_conflict1 *__k;
  _Self local_c8;
  int64_t local_c0;
  _Self local_b8;
  int local_ac;
  undefined4 local_a8;
  TPZGeoElSide local_98;
  int local_80;
  int local_7c;
  _Base_ptr local_78;
  _Self local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  int local_4c;
  _Base_ptr local_48;
  _Self local_40;
  ulong local_38;
  TPZGeoEl *local_30;
  _Self local_28;
  _Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_> local_20;
  key_type_conflict1 *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_>::_Rb_tree_iterator(&local_20);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>::
       begin(in_stack_fffffffffffffea8);
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
         ::end(in_stack_fffffffffffffea8);
    bVar1 = std::operator!=(&local_28,&local_40);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_> *)0x1a27101);
    local_30 = ppVar3->second;
    local_20._M_node = local_28._M_node;
    local_48 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_>::operator++
                         (in_stack_fffffffffffffeb8._M_node,
                          (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    local_4c = (**(code **)(*(long *)local_30 + 0x90))();
    local_38 = 0;
    while (((long)local_38 < (long)local_4c &&
           (lVar5 = (**(code **)(*(long *)local_30 + 0xa8))(local_30,local_38 & 0xffffffff),
           lVar5 != local_10))) {
      local_38 = local_38 + 1;
    }
    if (local_38 == (long)local_4c) {
      local_58 = local_20._M_node;
      local_60 = (_Base_ptr)
                 std::
                 map<long,TPZGeoEl*,std::less<long>,std::allocator<std::pair<long_const,TPZGeoEl*>>>
                 ::erase_abi_cxx11_(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
    }
  }
  local_68 = (_Base_ptr)
             std::
             map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
             ::begin(in_stack_fffffffffffffea8);
  local_28._M_node = local_68;
  do {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
         ::end(in_stack_fffffffffffffea8);
    bVar1 = std::operator!=(&local_28,&local_70);
    if (!bVar1) {
      return;
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_> *)0x1a27258);
    local_30 = ppVar3->second;
    local_78 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_long,_TPZGeoEl_*>_>::operator++
                         (in_stack_fffffffffffffeb8._M_node,
                          (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    local_7c = (**(code **)(*(long *)local_30 + 0xf0))();
    for (local_80 = 0; local_80 < local_7c; local_80 = local_80 + 1) {
      (**(code **)(*(long *)local_30 + 0x188))(&local_98,local_30,local_80);
      iVar2 = TPZGeoElSide::Exists(&local_98);
      if (iVar2 == 0) {
        local_a8 = 0xb;
      }
      else {
        pTVar4 = TPZGeoElSide::Element(&local_98);
        local_ac = (**(code **)(*(long *)pTVar4 + 0x90))();
        for (local_38 = 0; (long)local_38 < (long)local_ac; local_38 = local_38 + 1) {
          pTVar4 = TPZGeoElSide::Element(&local_98);
          lVar5 = (**(code **)(*(long *)pTVar4 + 0xa8))(pTVar4,local_38 & 0xffffffff);
          if (lVar5 == local_10) {
            __k = local_18;
            pTVar4 = TPZGeoElSide::Element(&local_98);
            local_c0 = TPZGeoEl::Id(pTVar4);
            local_b8._M_node =
                 (_Base_ptr)
                 std::
                 map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                 ::find(in_stack_fffffffffffffea8,(key_type_conflict1 *)0x1a2741b);
            local_c8._M_node =
                 (_Base_ptr)
                 std::
                 map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                 ::end(in_stack_fffffffffffffea8);
            bVar1 = std::operator==(&local_b8,&local_c8);
            if (bVar1) {
              pTVar6 = TPZGeoElSide::Element(&local_98);
              this_00 = TPZGeoElSide::Element(&local_98);
              in_stack_fffffffffffffeb8._M_node = (_Base_ptr)TPZGeoEl::Id(this_00);
              in_stack_fffffffffffffeb0 =
                   (map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                    *)std::
                      map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                      ::operator[]((map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                                    *)pTVar4,__k);
              *(TPZGeoEl **)&(in_stack_fffffffffffffeb0->_M_t)._M_impl = pTVar6;
              local_28._M_node =
                   (_Base_ptr)
                   std::
                   map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                   ::begin(in_stack_fffffffffffffea8);
            }
            break;
          }
        }
        local_a8 = 0;
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a27535);
    }
  } while( true );
}

Assistant:

void TPZGeoMesh::BuildElementsAroundNode(int64_t currentnode,map<int64_t,TPZGeoEl*> &elmap)
{
	// first eliminate all elements which do not contain currentnode
	//TPZPix iel = elmap.First();
	map<int64_t, TPZGeoEl *>::iterator ielprev,iel=elmap.begin();
	TPZGeoEl *el;
	int64_t i;
	while(iel!=elmap.end())
	{
		el = iel->second;
		ielprev=iel;
		iel++;//elmap.Next(iel);
		int numnode = el->NNodes();
		for(i=0; i< numnode; i++)
		{
			if(el->NodeIndex(i) == currentnode) break;
		}
		if(i == numnode)
		{
			elmap.erase(ielprev);
		}
	}
	iel = elmap.begin();
	while(iel!=elmap.end())
	{
		el = iel->second;//elmap.Contents(iel);
		iel++;//elmap.Next(iel);
		int nside = el->NSides();
		for(int is=0; is<nside; is++)
		{
			TPZGeoElSide neigh = el->Neighbour(is);
			if(!neigh.Exists()) continue;
			int numnode = neigh.Element()->NNodes();
			for(i=0; i< numnode; i++)
			{
				if(neigh.Element()->NodeIndex(i) == currentnode)
				{
					if(elmap.find(neigh.Element()->Id())==elmap.end())
					{
						// this should be implemented as a stack, so that we dont have to
						// go through the list again each time
						elmap[neigh.Element()->Id()] = neigh.Element();
						iel = elmap.begin();
					}
					break;	// get out of the loop over the nodes
				}
			}
		}
	}
}